

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::GetSseSum8x8QuadTest_DISABLED_Speed_Test::TestBody
          (GetSseSum8x8QuadTest_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  int iVar1;
  double dVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  long local_110;
  uint sse_tot_simd;
  uint sse_tot_c;
  ulong local_f8;
  long local_f0;
  long local_e8;
  int sum_tot_simd;
  int sum_tot_c;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  aom_usec_timer timer;
  uint var1 [4];
  int sum2 [4];
  int sum1 [4];
  uint var2 [4];
  uint sse2 [4];
  uint sse1 [4];
  
  iVar1 = (this->super_GetSseSum8x8QuadTest).params_.block_size;
  uVar3 = (uint)(1000000000 / (long)iVar1);
  if (0 < iVar1) {
    this_00 = &(this->super_GetSseSum8x8QuadTest).rnd_;
    lVar8 = 0;
    do {
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_GetSseSum8x8QuadTest).src_[lVar8] = (uint8_t)(uVar4 >> 0x17);
      uVar4 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_GetSseSum8x8QuadTest).ref_[lVar8] = (uint8_t)(uVar4 >> 0x17);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->super_GetSseSum8x8QuadTest).params_.block_size);
  }
  sse1[0] = 0;
  sse1[1] = 0;
  sse1[2] = 0;
  sse1[3] = 0;
  sse2[0] = 0;
  sse2[1] = 0;
  sse2[2] = 0;
  sse2[3] = 0;
  var1[0] = 0;
  var1[1] = 0;
  var1[2] = 0;
  var1[3] = 0;
  var2[0] = 0;
  var2[1] = 0;
  var2[2] = 0;
  var2[3] = 0;
  sum1[0] = 0;
  sum1[1] = 0;
  sum1[2] = 0;
  sum1[3] = 0;
  sum2[0] = 0;
  sum2[1] = 0;
  sum2[2] = 0;
  sum2[3] = 0;
  sse_tot_c = 0;
  sse_tot_simd = 0;
  sum_tot_c = 0;
  sum_tot_simd = 0;
  iVar1 = (this->super_GetSseSum8x8QuadTest).params_.width;
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  if (0 < (int)uVar3) {
    local_f0 = (long)iVar1 * 8;
    uVar6 = 0;
    do {
      local_f8 = uVar6;
      if (0 < (this->super_GetSseSum8x8QuadTest).params_.height) {
        local_110 = 0;
        lVar8 = 0;
        do {
          local_e8 = lVar8;
          if (0 < (this->super_GetSseSum8x8QuadTest).params_.width) {
            iVar9 = 0;
            lVar8 = local_110;
            do {
              aom_get_var_sse_sum_8x8_quad_c
                        ((this->super_GetSseSum8x8QuadTest).src_ + lVar8,iVar1,
                         (this->super_GetSseSum8x8QuadTest).ref_ + lVar8,iVar1,sse2,sum2,&sse_tot_c,
                         &sum_tot_c,var2);
              iVar9 = iVar9 + 0x20;
              lVar8 = lVar8 + 0x20;
            } while (iVar9 < (this->super_GetSseSum8x8QuadTest).params_.width);
          }
          lVar8 = local_e8 + 8;
          local_110 = local_110 + local_f0;
        } while (lVar8 < (this->super_GetSseSum8x8QuadTest).params_.height);
      }
      uVar5 = (int)local_f8 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != uVar3);
  }
  uVar6 = 0;
  gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
  local_c8 = timer.end.tv_sec;
  local_c0 = timer.end.tv_usec;
  local_d8 = timer.begin.tv_sec;
  local_d0 = timer.begin.tv_usec;
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  if (0 < (int)uVar3) {
    local_f0 = (long)iVar1 * 8;
    do {
      local_f8 = uVar6;
      if (0 < (this->super_GetSseSum8x8QuadTest).params_.height) {
        local_110 = 0;
        lVar8 = 0;
        do {
          local_e8 = lVar8;
          if (0 < (this->super_GetSseSum8x8QuadTest).params_.width) {
            iVar9 = 0;
            lVar8 = local_110;
            do {
              (*(this->super_GetSseSum8x8QuadTest).params_.func)
                        ((this->super_GetSseSum8x8QuadTest).src_ + lVar8,iVar1,
                         (this->super_GetSseSum8x8QuadTest).ref_ + lVar8,iVar1,sse1,sum1,
                         &sse_tot_simd,&sum_tot_simd,var1);
              iVar9 = iVar9 + 0x20;
              lVar8 = lVar8 + 0x20;
            } while (iVar9 < (this->super_GetSseSum8x8QuadTest).params_.width);
          }
          lVar8 = local_e8 + 8;
          local_110 = local_110 + local_f0;
        } while (lVar8 < (this->super_GetSseSum8x8QuadTest).params_.height);
      }
      uVar5 = (int)local_f8 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != uVar3);
  }
  lVar7 = local_c0 - local_d0;
  lVar8 = lVar7 + 1000000;
  if (-1 < lVar7) {
    lVar8 = lVar7;
  }
  dVar2 = (double)(lVar8 + ((lVar7 >> 0x3f) + (local_c8 - local_d8)) * 1000000);
  gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
  lVar7 = timer.end.tv_usec - timer.begin.tv_usec;
  lVar8 = lVar7 + 1000000;
  if (-1 < lVar7) {
    lVar8 = lVar7;
  }
  dVar10 = (double)(((lVar7 >> 0x3f) + (timer.end.tv_sec - timer.begin.tv_sec)) * 1000000 + lVar8);
  printf("aom_getvar_8x8_quad for block=%dx%d : ref_time=%lf \t simd_time=%lf \t gain=%lf \n",
         SUB84(dVar2,0),dVar10,dVar2 / dVar10,
         (ulong)(uint)(this->super_GetSseSum8x8QuadTest).params_.width,
         (ulong)(uint)(this->super_GetSseSum8x8QuadTest).params_.height);
  return;
}

Assistant:

TEST_P(GetSseSum8x8QuadTest, DISABLED_Speed) { SseSum_SpeedTest(); }